

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O0

string * anon_unknown.dwarf_a364c::repeat(string *__return_storage_ptr__,string *s,size_t count)

{
  undefined8 local_30;
  size_t i;
  size_t count_local;
  string *s_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_30 = 0; local_30 < count; local_30 = local_30 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string repeat(std::string s, size_t count) {
  std::string result;
  for (size_t i = 0; i < count; ++i) {
    result += s;
  }
  return result;
}